

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_eori_to_ccr(m68k_info *info)

{
  m68k_info *in_RDI;
  m68k_reg unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  
  read_imm_8(in_RDI);
  build_imm_special_reg(info,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  return;
}

Assistant:

static void d68000_eori_to_ccr(m68k_info *info)
{
	build_imm_special_reg(info, M68K_INS_EORI, read_imm_8(info), 1, M68K_REG_CCR);
}